

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deadline_timer_service.hpp
# Opt level: O1

void __thiscall
asio::detail::
deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::~deadline_timer_service
          (deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
           *this)

{
  pointer phVar1;
  
  epoll_reactor::
  remove_timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
            (this->scheduler_,&this->timer_queue_);
  (this->timer_queue_).super_timer_queue_base._vptr_timer_queue_base =
       (_func_int **)&PTR__timer_queue_001d40d8;
  phVar1 = (this->timer_queue_).heap_.
           super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (phVar1 != (pointer)0x0) {
    operator_delete(phVar1);
    return;
  }
  return;
}

Assistant:

~deadline_timer_service()
  {
    scheduler_.remove_timer_queue(timer_queue_);
  }